

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_define_foreign_aux
               (sexp ctx,sexp env,char *name,int num_args,int flags,char *fname,sexp_proc1 f,
               sexp data)

{
  sexp sym;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_58;
  sexp local_50;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_48.var = &local_50;
  local_50 = (sexp)0x43e;
  local_38.next = &local_48;
  local_38.var = &local_58;
  local_58 = (sexp)0x43e;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_38.next;
  (ctx->value).context.saves = &local_38;
  local_58 = sexp_make_foreign(ctx,name,num_args,flags,fname,f,data);
  if ((((ulong)local_58 & 3) != 0) || (local_58->tag != 0x13)) {
    local_50 = sexp_intern(ctx,name,-1);
    sexp_env_define(ctx,env,local_50,local_58);
  }
  (ctx->value).context.saves = local_48.next;
  return local_58;
}

Assistant:

sexp sexp_define_foreign_aux (sexp ctx, sexp env, const char *name, int num_args,
                              int flags, const char *fname, sexp_proc1 f, sexp data) {
  sexp_gc_var2(sym, res);
  sexp_gc_preserve2(ctx, sym, res);
  res = sexp_make_foreign(ctx, name, num_args, flags, fname, f, data);
  if (!sexp_exceptionp(res))
    sexp_env_define(ctx, env, sym = sexp_intern(ctx, name, -1), res);
  sexp_gc_release2(ctx);
  return res;
}